

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cc
# Opt level: O0

string * __thiscall
kratos::get_trigger_attribute_abi_cxx11_
          (string *__return_storage_ptr__,kratos *this,shared_ptr<kratos::StmtBlock> *blk)

{
  bool bVar1;
  element_type *root;
  string *in_R8;
  allocator<char> local_e9;
  string local_e8 [32];
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_c8;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_c0;
  undefined4 local_b8;
  allocator<char> local_b1;
  __node_base_ptr *local_b0;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *values;
  undefined1 local_98 [8];
  TriggerConditionVisitor visitor;
  shared_ptr<kratos::StmtBlock> *blk_local;
  
  visitor.values._M_h._M_single_bucket = (__node_base_ptr)this;
  TriggerConditionVisitor::TriggerConditionVisitor((TriggerConditionVisitor *)local_98);
  root = std::__shared_ptr<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2>::get
                   ((__shared_ptr<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2> *)
                    visitor.values._M_h._M_single_bucket);
  IRVisitor::visit_root((IRVisitor *)local_98,(IRNode *)root);
  local_b0 = &visitor.super_IRVisitor.visited_._M_h._M_single_bucket;
  bVar1 = std::
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_b0);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",&local_b1);
    std::allocator<char>::~allocator(&local_b1);
  }
  else {
    local_c0._M_cur =
         (__node_type *)
         std::
         unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_b0);
    local_c8._M_cur =
         (__node_type *)
         std::
         unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_b0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_e8," ",&local_e9);
    string::join<std::__detail::_Node_const_iterator<std::__cxx11::string,true,true>>
              (__return_storage_ptr__,(string *)local_c0._M_cur,
               (_Node_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
                )local_c8._M_cur,
               (_Node_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
                )local_e8,in_R8);
    std::__cxx11::string::~string(local_e8);
    std::allocator<char>::~allocator(&local_e9);
  }
  local_b8 = 1;
  TriggerConditionVisitor::~TriggerConditionVisitor((TriggerConditionVisitor *)local_98);
  return __return_storage_ptr__;
}

Assistant:

std::string get_trigger_attribute(const std::shared_ptr<StmtBlock> &blk) {
    TriggerConditionVisitor visitor;
    visitor.visit_root(blk.get());
    auto const &values = visitor.values;
    if (values.empty()) return "";
    return string::join(values.begin(), values.end(), " ");
}